

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O2

void QAnimationTimer::registerAnimation(QAbstractAnimation *animation,bool isTopLevel)

{
  QAnimationTimer *obj;
  undefined7 in_register_00000031;
  
  obj = instance(true);
  registerRunningAnimation((QAnimationTimer *)obj,animation);
  if ((int)CONCAT71(in_register_00000031,isTopLevel) != 0) {
    *(undefined1 *)((long)&(animation->super_QObject).d_ptr.d[1].bindingStorage.d + 1) = 1;
    QList<QAbstractAnimation_*>::append(&obj->animationsToStart,animation);
    if (obj->startAnimationPending == false) {
      obj->startAnimationPending = true;
      QMetaObject::invokeMethod<>((QObject *)obj,"startAnimations",QueuedConnection);
      return;
    }
  }
  return;
}

Assistant:

void QAnimationTimer::registerAnimation(QAbstractAnimation *animation, bool isTopLevel)
{
    QAnimationTimer *inst = instance(true); //we create the instance if needed
    inst->registerRunningAnimation(animation);
    if (isTopLevel) {
        Q_ASSERT(!QAbstractAnimationPrivate::get(animation)->hasRegisteredTimer);
        QAbstractAnimationPrivate::get(animation)->hasRegisteredTimer = true;
        inst->animationsToStart << animation;
        if (!inst->startAnimationPending) {
            inst->startAnimationPending = true;
            QMetaObject::invokeMethod(inst, "startAnimations", Qt::QueuedConnection);
        }
    }
}